

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall IndexNode<int>::IndexNode(IndexNode<int> *this,int N)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  allocator<Addr> local_81;
  vector<Addr,_std::allocator<Addr>_> local_80;
  allocator_type local_61;
  vector<char,_std::allocator<char>_> local_60;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18;
  int local_14;
  int i;
  int N_local;
  IndexNode<int> *this_local;
  
  local_14 = N;
  _i = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->k);
  std::vector<char,_std::allocator<char>_>::vector(&this->v);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&this->p);
  sVar1 = (size_type)local_14;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,sVar1,&local_31);
  std::vector<int,_std::allocator<int>_>::operator=(&this->k,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  sVar1 = (size_type)local_14;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_60,sVar1,&local_61);
  std::vector<char,_std::allocator<char>_>::operator=(&this->v,&local_60);
  std::vector<char,_std::allocator<char>_>::~vector(&local_60);
  std::allocator<char>::~allocator(&local_61);
  sVar1 = (size_type)local_14;
  std::allocator<Addr>::allocator(&local_81);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_80,sVar1,&local_81);
  std::vector<Addr,_std::allocator<Addr>_>::operator=(&this->p,&local_80);
  std::vector<Addr,_std::allocator<Addr>_>::~vector(&local_80);
  std::allocator<Addr>::~allocator(&local_81);
  this->NodeState = '0';
  (this->parent).BlockNum = -1;
  (this->parent).FileOff = -1;
  (this->self).BlockNum = -1;
  (this->self).FileOff = -1;
  for (local_18 = 0; local_18 < local_14 + -1; local_18 = local_18 + 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->v,(long)local_18);
    *pvVar2 = '0';
    pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&this->p,(long)local_18);
    pvVar3->BlockNum = -1;
    pvVar3->FileOff = -1;
  }
  pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&this->p,(long)(local_14 + -1));
  pvVar3->BlockNum = -1;
  pvVar3->FileOff = -1;
  return;
}

Assistant:

IndexNode<K>::IndexNode(int N) {
	int i;
	k = vector<K>(N);
	v = vector<char>(N);
	p = vector<Addr>(N);
	this->NodeState = INTERNAL;
	this->parent = { -1, -1 };
	this->self = { -1, -1 };
	for (i = 0; i < N - 1; i++) {
		this->v[i] = '0';
		this->p[i] = { -1, -1 };
	}
	this->p[N - 1] = { -1, -1 };
}